

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O2

void visit_unary_expr(gvisitor_t *self,gnode_unary_expr_t *node)

{
  gnode_t *node_00;
  _Bool _Var1;
  
  gvisit(self,node->expr);
  node_00 = node->expr;
  _Var1 = is_expression_valid(node_00);
  if (_Var1) {
    return;
  }
  report_error(self,GRAVITY_ERROR_SEMANTIC,node_00,"Invalid expression.");
  return;
}

Assistant:

static void visit_unary_expr (gvisitor_t *self, gnode_unary_expr_t *node) {
    DEBUG_CODEGEN("visit_unary_expr %s", token_name(node->op));
    DECLARE_CODE();

    CODEGEN_COUNT_REGISTERS(n1);

    // unary expression can be:
    //    +    Unary PLUS
    //    -    Unary MINUS
    //    !    Logical NOT
    //    ~    Bitwise NOT

    visit(node->expr);
    if (node->op == TOK_OP_ADD) {
        // +1 is just 1 and more generally +expr is just expr so ignore + and proceed
        return;
    }

    uint32_t r2 = ircode_register_pop(code);
    if (r2 == REGISTER_ERROR) report_error(self, (gnode_t *)node, "Invalid unary expression.");
    uint32_t r1 = ircode_register_push_temp(code);

    opcode_t op = (node->op == TOK_OP_SUB) ? NEG : token2opcode(node->op);
	ircode_add(code, op, r1, r2, 0, LINE_NUMBER(node));

    CODEGEN_COUNT_REGISTERS(n2);
    CODEGEN_ASSERT_REGISTERS(n1, n2, 1);
}